

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O1

void Ree_ManCutPrint(int *pCut,int Count,word Truth,int iObj)

{
  bool bVar1;
  FILE *__stream;
  uint uVar2;
  undefined4 in_register_00000034;
  word *pThis;
  ulong *puVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  word local_28;
  
  puVar3 = &local_28;
  local_28 = Truth;
  printf("%d : %d : ",CONCAT44(in_register_00000034,Count),(ulong)(uint)iObj);
  if (*pCut < 1) {
    lVar6 = 1;
  }
  else {
    lVar5 = 1;
    do {
      printf("%3d ",(ulong)(uint)pCut[lVar5]);
      lVar6 = lVar5 + 1;
      bVar1 = lVar5 < *pCut;
      lVar5 = lVar6;
    } while (bVar1);
  }
  if ((uint)lVar6 < 5) {
    iVar4 = (uint)lVar6 - 5;
    do {
      printf("    ");
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
  printf("0x");
  __stream = _stdout;
  do {
    lVar6 = 4;
    do {
      uVar2 = (uint)(*puVar3 >> ((byte)lVar6 & 0x3f)) & 0xf;
      iVar4 = uVar2 + 0x30;
      if (9 < uVar2) {
        iVar4 = uVar2 + 0x37;
      }
      fputc(iVar4,__stream);
      lVar6 = lVar6 + -4;
    } while (lVar6 != -4);
    puVar3 = puVar3 + -1;
  } while (&local_28 <= puVar3);
  putchar(10);
  return;
}

Assistant:

void Ree_ManCutPrint( int * pCut, int Count, word Truth, int iObj )
{
    int c;
    printf( "%d : %d : ", Count, iObj );
    for ( c = 1; c <= pCut[0]; c++ )
        printf( "%3d ", pCut[c] );
    for (      ; c <= 4; c++ )
        printf( "    " );
    printf( "0x" );
    Abc_TtPrintHexRev( stdout, &Truth, 3 );
    printf( "\n" );
}